

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

double ON_MeshParameters::MeshDensityAsPercentage(double normalized_mesh_density)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = ON_DBL_QNAN;
  if ((0.0 <= normalized_mesh_density) && (normalized_mesh_density <= 1.0)) {
    dVar3 = normalized_mesh_density * 100.0;
    dVar2 = floor(dVar3 + 0.25);
    if (0.0001 < ABS(dVar2 - dVar3)) {
      dVar2 = floor(normalized_mesh_density * 1024.0 + 0.25);
      dVar2 = dVar2 * 0.0009765625 * 100.0;
      uVar1 = -(ulong)(0.0001 < ABS(dVar2 - dVar3));
      dVar2 = (double)(~uVar1 & (ulong)dVar2 | (ulong)dVar3 & uVar1);
    }
  }
  return dVar2;
}

Assistant:

double ON_MeshParameters::MeshDensityAsPercentage(double normalized_mesh_density)
{
  if (normalized_mesh_density >= 0.0 && normalized_mesh_density <= 1.0)
  {
    const double percent_fuzz_tol = 1.0e-4;
    const double slider_percent = normalized_mesh_density * 100.0; // percent = slider_value as a percentage.
    const double n = floor(slider_percent + 0.25);
    if (fabs(n - slider_percent) <= percent_fuzz_tol)
      return n; // slider_percent is within fuzz of being an integer - return the integer

    const double p = 100.0*(floor(1024.0 * normalized_mesh_density + 0.25) / 1024.0);
    if (fabs(p - slider_percent) <= percent_fuzz_tol)
      return p; // slider_percent is within fuzz of 100.0*(N/1024.0). Return 100.0*(N/1024.0).

    return slider_percent; // return percentage with no fuzz removal
  }
  return ON_DBL_QNAN; // not a percent
}